

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

cio_error cio_uart_get_flow_control(cio_uart *port,cio_uart_flow_control *flow_control)

{
  cio_error cVar1;
  cio_uart_flow_control cVar2;
  termios tty;
  
  if (port == (cio_uart *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  cVar1 = get_current_settings(port,&tty);
  if (cVar1 == CIO_SUCCESS) {
    if ((int)tty.c_cflag < 0) {
      if ((tty.c_iflag & 0x1c00) == 0x1c00) {
        return CIO_PROTOCOL_NOT_SUPPORTED;
      }
      cVar2 = CIO_UART_FLOW_CONTROL_RTS_CTS;
    }
    else {
      cVar2 = (uint)((tty.c_iflag & 0x1c00) == 0x1c00) * 2;
    }
    *flow_control = cVar2;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

enum cio_error cio_uart_get_flow_control(const struct cio_uart *port, enum cio_uart_flow_control *flow_control)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if (!cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_NONE;
	} else if (cts_rts_enabled(tty.c_cflag) && !xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_RTS_CTS;
	} else if (!cts_rts_enabled(tty.c_cflag) && xon_xoff_enabled(tty.c_iflag)) {
		*flow_control = CIO_UART_FLOW_CONTROL_XON_XOFF;
	} else {
		return CIO_PROTOCOL_NOT_SUPPORTED;
	}

	return CIO_SUCCESS;
}